

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_arena.c
# Opt level: O0

void slab_arena_flags_init(slab_arena *arena,int flags)

{
  int flags_local;
  slab_arena *arena_local;
  
  if ((flags & 0x80000000U) == 0) {
    if ((flags & 3U) == 0) {
      __assert_fail("flags & (MAP_PRIVATE | MAP_SHARED)",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_arena.c"
                    ,0xa4,"void slab_arena_flags_init(struct slab_arena *, int)");
    }
    if (flags == 2) {
      arena->flags = -0x7fffffff;
    }
    else {
      arena->flags = -0x7ffffffe;
    }
  }
  else {
    if (((flags & 0x80000001U) != 0x80000001) && ((flags & 0x80000002U) != 0x80000002)) {
      __assert_fail("IS_SLAB_ARENA_FLAG(flags, SLAB_ARENA_PRIVATE) || IS_SLAB_ARENA_FLAG(flags, SLAB_ARENA_SHARED)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_arena.c"
                    ,0xad,"void slab_arena_flags_init(struct slab_arena *, int)");
    }
    arena->flags = flags;
  }
  return;
}

Assistant:

static void
slab_arena_flags_init(struct slab_arena *arena, int flags)
{
	/*
	 * Old interface for backward compatibility, MAP_
	 * flags are passed directly without SLAB_ARENA_FLAG_MARK,
	 * map them to internal ones.
	 */
	if (!(flags & SLAB_ARENA_FLAG_MARK)) {
		assert(flags & (MAP_PRIVATE | MAP_SHARED));
		if (flags == MAP_PRIVATE)
			arena->flags = SLAB_ARENA_PRIVATE;
		else
			arena->flags = SLAB_ARENA_SHARED;
		return;
	}

	assert(IS_SLAB_ARENA_FLAG(flags, SLAB_ARENA_PRIVATE) ||
	       IS_SLAB_ARENA_FLAG(flags, SLAB_ARENA_SHARED));

	arena->flags = flags;
}